

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_doomedmap.cpp
# Opt level: O2

void Cmd_dumpmapthings(FCommandLine *argv,APlayerPawn *who,int key)

{
  Pair *pPVar1;
  PClassActor *pPVar2;
  bool bVar3;
  hash_t max;
  NameEntry *pNVar4;
  long lVar5;
  ulong uVar6;
  uint i;
  ulong uVar7;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  infos;
  Pair *pair;
  Iterator it;
  
  max = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CountUsed
                  (&DoomEdMap);
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::TArray(&infos,max);
  it.Map = &DoomEdMap;
  it.Position = 0;
  while( true ) {
    bVar3 = TMapIterator<int,_FDoomEdEntry,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>_>
            ::NextPair(&it,&pair);
    if (!bVar3) break;
    TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
    ::Push(&infos,&pair);
  }
  if ((ulong)infos.Count == 0) {
    Printf("No map things registered\n");
  }
  else {
    qsort(infos.Array,(ulong)infos.Count,8,sortnums);
    for (uVar7 = 0; uVar7 < infos.Count; uVar7 = uVar7 + 1) {
      pPVar1 = infos.Array[uVar7];
      pPVar2 = (pPVar1->Value).Type;
      if (pPVar2 == (PClassActor *)0x0) {
        lVar5 = (long)(pPVar1->Value).Special;
        uVar6 = (ulong)(uint)pPVar1->Key;
        if (0 < lVar5) {
          pNVar4 = (NameEntry *)(&DAT_007f4308 + lVar5 * 8);
          goto LAB_0045488c;
        }
        Printf("%6d none\n",uVar6);
      }
      else {
        uVar6 = (ulong)(uint)pPVar1->Key;
        pNVar4 = FName::NameData.NameArray +
                 (pPVar2->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
LAB_0045488c:
        Printf("%6d %s\n",uVar6,pNVar4->Text);
      }
    }
  }
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::~TArray(&infos);
  return;
}

Assistant:

CCMD (dumpmapthings)
{
	TArray<FDoomEdMap::Pair*> infos(DoomEdMap.CountUsed());
	FDoomEdMap::Iterator it(DoomEdMap);
	FDoomEdMap::Pair *pair;

	while (it.NextPair(pair))
	{
		infos.Push(pair);
	}

	if (infos.Size () == 0)
	{
		Printf ("No map things registered\n");
	}
	else
	{
		qsort (&infos[0], infos.Size (), sizeof(FDoomEdMap::Pair*), sortnums);

		for (unsigned i = 0; i < infos.Size (); ++i)
		{
			if (infos[i]->Value.Type != NULL)
			{
				Printf("%6d %s\n", infos[i]->Key, infos[i]->Value.Type->TypeName.GetChars());
			}
			else if (infos[i]->Value.Special > 0)
			{
				Printf("%6d %s\n", infos[i]->Key, SpecialMapthingNames[infos[i]->Value.Special - 1]);
			}
			else
			{
				Printf("%6d none\n", infos[i]->Key);
			}

		}
	}
}